

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymPropBase::write_to_obj_file(CTcSymPropBase *this,CVmFile *fp)

{
  bool bVar1;
  
  bVar1 = (this->field_0x2a & 1) != 0;
  if (bVar1) {
    CTcSymbolBase::write_to_file_gen((CTcSymbolBase *)this,fp);
    CVmFile::write_uint4(fp,(uint)this->prop_);
  }
  return (uint)bVar1;
}

Assistant:

int CTcSymPropBase::write_to_obj_file(CVmFile *fp)
{
    /* 
     *   If the property has never been referenced, don't bother writing it.
     *   We must have picked up the definition from an external symbol set we
     *   loaded but have no references of our own to the property.  
     */
    if (!ref_)
        return FALSE;

    /* inherit default */
    CTcSymbol::write_to_obj_file(fp);

    /* 
     *   write my local property ID value - when we load the object file,
     *   we'll need to figure out the translation from our original numbering
     *   system to the new numbering system used in the final image file 
     */
    fp->write_uint4((ulong)prop_);

    /* written */
    return TRUE;
}